

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O1

SecretKey * jbcoin::randomSecretKey(void)

{
  SecretKey *in_RDI;
  uint8_t buf [32];
  Slice local_48;
  uint8_t local_38 [40];
  
  crypto_prng();
  beast::rngfill<jbcoin::csprng_engine>(local_38,0x20,&crypto_prng::engine);
  local_48.size_ = 0x20;
  local_48.data_ = local_38;
  SecretKey::SecretKey(in_RDI,&local_48);
  beast::secure_erase<void>(local_38,0x20);
  return in_RDI;
}

Assistant:

SecretKey
randomSecretKey()
{
    std::uint8_t buf[32];
    beast::rngfill(
        buf,
        sizeof(buf),
        crypto_prng());
    SecretKey sk(Slice{ buf, sizeof(buf) });
    beast::secure_erase(buf, sizeof(buf));
    return sk;
}